

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogExecution.cpp
# Opt level: O0

Pass * wasm::createLogExecutionPass(void)

{
  LogExecution *this;
  
  this = (LogExecution *)operator_new(0x140);
  memset(this,0,0x140);
  LogExecution::LogExecution(this);
  return (Pass *)this;
}

Assistant:

Pass* createLogExecutionPass() { return new LogExecution(); }